

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::StoreComponentOfValueTo
          (InterfaceVariableScalarReplacement *this,uint32_t component_type_id,uint32_t value_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices,Instruction *ptr,
          uint32_t *extra_array_index,Instruction *insert_before)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Instruction *pIVar1;
  IRContext *pIVar2;
  pointer pIVar3;
  pointer this_00;
  DefUseManager *this_01;
  DefUseManager *def_use_mgr;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  Operand local_e0;
  uint32_t local_ac;
  iterator local_a8;
  undefined8 local_a0;
  SmallVector<unsigned_int,_2UL> local_98;
  Operand local_70;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_store
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  composite_extract;
  uint32_t *extra_array_index_local;
  Instruction *ptr_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices_local;
  uint32_t value_id_local;
  uint32_t component_type_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  pIVar1 = CreateCompositeExtract
                     (this,component_type_id,value_id,component_indices,extra_array_index);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&new_store,pIVar1);
  pIVar1 = (Instruction *)::operator_new(0x70);
  pIVar2 = Pass::context(&this->super_Pass);
  opt::Instruction::Instruction(pIVar1,pIVar2,OpStore);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_40,pIVar1);
  pIVar3 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_40);
  local_ac = opt::Instruction::result_id(ptr);
  local_a8 = &local_ac;
  local_a0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_a8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
  Operand::Operand(&local_70,SPV_OPERAND_TYPE_ID,&local_98);
  opt::Instruction::AddOperand(pIVar3,&local_70);
  Operand::~Operand(&local_70);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  pIVar3 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_40);
  this_00 = std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::operator->(&new_store);
  def_use_mgr._4_4_ = opt::Instruction::result_id(this_00);
  local_118 = (iterator)((long)&def_use_mgr + 4);
  local_110 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_118;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list);
  Operand::Operand(&local_e0,SPV_OPERAND_TYPE_ID,&local_108);
  opt::Instruction::AddOperand(pIVar3,&local_e0);
  Operand::~Operand(&local_e0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  pIVar2 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(pIVar2);
  pIVar3 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(&new_store);
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar3);
  pIVar3 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(&local_40);
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar3);
  opt::Instruction::InsertBefore(insert_before,&new_store);
  opt::Instruction::InsertBefore(insert_before,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_40);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&new_store);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::StoreComponentOfValueTo(
    uint32_t component_type_id, uint32_t value_id,
    const std::vector<uint32_t>& component_indices, Instruction* ptr,
    const uint32_t* extra_array_index, Instruction* insert_before) {
  std::unique_ptr<Instruction> composite_extract(CreateCompositeExtract(
      component_type_id, value_id, component_indices, extra_array_index));

  std::unique_ptr<Instruction> new_store(
      new Instruction(context(), spv::Op::OpStore));
  new_store->AddOperand({SPV_OPERAND_TYPE_ID, {ptr->result_id()}});
  new_store->AddOperand(
      {SPV_OPERAND_TYPE_ID, {composite_extract->result_id()}});

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  def_use_mgr->AnalyzeInstDefUse(composite_extract.get());
  def_use_mgr->AnalyzeInstDefUse(new_store.get());

  insert_before->InsertBefore(std::move(composite_extract));
  insert_before->InsertBefore(std::move(new_store));
}